

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::EnableProgressBarPrintSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *config;
  ClientConfig CStack_1f8;
  
  config = ClientConfig::GetConfig(context);
  ProgressBar::SystemOverrideCheck(config);
  switchD_016d4fed::default(&CStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&CStack_1f8);
  config->print_progress_bar = CStack_1f8.print_progress_bar;
  ClientConfig::~ClientConfig(&CStack_1f8);
  return;
}

Assistant:

void EnableProgressBarPrintSetting::ResetLocal(ClientContext &context) {
	auto &config = ClientConfig::GetConfig(context);
	ProgressBar::SystemOverrideCheck(config);
	config.print_progress_bar = ClientConfig().print_progress_bar;
}